

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

void Ga2_ManReportMemory(Ga2_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  long lVar10;
  int level;
  Vec_Vec_t *p_00;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined4 local_118;
  undefined4 local_108;
  undefined4 local_f8;
  undefined4 local_e8;
  undefined4 local_d8;
  undefined4 local_a8;
  
  pVVar3 = p->pGia->vMapping;
  dVar21 = 0.0;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    dVar21 = (double)pVVar3->nCap * 4.0 + 16.0;
  }
  iVar1 = p->pGia->nObjsAlloc;
  dVar6 = sat_solver2_memory(p->pSat,1);
  dVar7 = sat_solver2_memory_proof(p->pSat);
  dVar8 = Vec_VecMemoryInt((Vec_Vec_t *)p->vId2Lit);
  dVar9 = Rnm_ManMemoryUsage(p->pRnm);
  iVar2 = p->nTable;
  p_00 = (Vec_Vec_t *)p->vCnfs;
  dVar12 = Vec_VecMemoryInt(p_00);
  level = (int)p_00;
  dVar19 = 0.0;
  if (p->vIds != (Vec_Int_t *)0x0) {
    dVar19 = (double)p->vIds->nCap * 4.0 + 16.0;
  }
  dVar11 = 0.0;
  dVar13 = 0.0;
  if (p->vProofIds != (Vec_Int_t *)0x0) {
    dVar13 = (double)p->vProofIds->nCap * 4.0 + 16.0;
  }
  if (p->vAbs != (Vec_Int_t *)0x0) {
    dVar11 = (double)p->vAbs->nCap * 4.0 + 16.0;
  }
  dVar15 = 0.0;
  dVar16 = 0.0;
  if (p->vValues != (Vec_Int_t *)0x0) {
    dVar16 = (double)p->vValues->nCap * 4.0 + 16.0;
  }
  if (p->vLits != (Vec_Int_t *)0x0) {
    dVar15 = (double)p->vLits->nCap * 4.0 + 16.0;
  }
  dVar18 = 0.0;
  if (p->vIsopMem != (Vec_Int_t *)0x0) {
    dVar18 = (double)p->vIsopMem->nCap * 4.0 + 16.0;
  }
  lVar10 = (long)iVar2 * 0x18;
  auVar14._8_4_ = (int)((ulong)lVar10 >> 0x20);
  auVar14._0_8_ = lVar10;
  auVar14._12_4_ = 0x45300000;
  dVar20 = (auVar14._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0);
  dVar21 = (double)iVar1 * 12.0 + dVar21;
  dVar11 = dVar18 + dVar15 + dVar16 + dVar11 + dVar12 + 224.0 + dVar19 + dVar13 + 926274.0;
  dVar19 = dVar20 + dVar9 + dVar8 + dVar7 + dVar6 + dVar21 + dVar11;
  Abc_Print(level,"%s =","Memory: AIG      ");
  bVar4 = NAN(dVar19);
  bVar5 = dVar19 == 0.0;
  dVar12 = (dVar21 * 100.0) / dVar19;
  if ((bVar5) && (!bVar4)) {
    dVar12 = 0.0;
  }
  dVar13 = (dVar6 * 100.0) / dVar19;
  if ((bVar5) && (!bVar4)) {
    dVar13 = 0.0;
  }
  dVar15 = (dVar7 * 100.0) / dVar19;
  if ((bVar5) && (!bVar4)) {
    dVar15 = 0.0;
  }
  dVar16 = (dVar8 * 100.0) / dVar19;
  if ((bVar5) && (!bVar4)) {
    dVar16 = 0.0;
  }
  dVar18 = (dVar9 * 100.0) / dVar19;
  if ((bVar5) && (!bVar4)) {
    dVar18 = 0.0;
  }
  dVar22 = (dVar20 * 100.0) / dVar19;
  if ((bVar5) && (!bVar4)) {
    dVar22 = 0.0;
  }
  dVar23 = (dVar11 * 100.0) / dVar19;
  if ((bVar5) && (!bVar4)) {
    dVar23 = 0.0;
  }
  dVar17 = (dVar19 * 100.0) / dVar19;
  if ((bVar5) && (!bVar4)) {
    dVar17 = 0.0;
  }
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",SUB84(dVar21 * 9.5367431640625e-07,0),dVar12);
  Abc_Print(level,"%s =","Memory: SAT      ");
  local_108 = SUB84(dVar6 * 9.5367431640625e-07,0);
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",local_108,dVar13);
  Abc_Print(level,"%s =","Memory: Proof    ");
  local_f8 = SUB84(dVar7 * 9.5367431640625e-07,0);
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",local_f8,dVar15);
  Abc_Print(level,"%s =","Memory: Map      ");
  local_e8 = SUB84(dVar8 * 9.5367431640625e-07,0);
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",local_e8,dVar16);
  Abc_Print(level,"%s =","Memory: Refine   ");
  local_d8 = SUB84(dVar9 * 9.5367431640625e-07,0);
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",local_d8,dVar18);
  Abc_Print(level,"%s =","Memory: Hash     ");
  local_118 = SUB84(dVar20 * 9.5367431640625e-07,0);
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",local_118,dVar22);
  Abc_Print(level,"%s =","Memory: Other    ");
  local_a8 = SUB84(dVar11 * 9.5367431640625e-07,0);
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",local_a8,dVar23);
  Abc_Print(level,"%s =","Memory: TOTAL    ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",SUB84(dVar19 * 9.5367431640625e-07,0),dVar17);
  return;
}

Assistant:

void Ga2_ManReportMemory( Ga2_Man_t * p )
{
    double memTot = 0;
    double memAig = 1.0 * p->pGia->nObjsAlloc * sizeof(Gia_Obj_t) + Vec_IntMemory(p->pGia->vMapping);
    double memSat = sat_solver2_memory( p->pSat, 1 );
    double memPro = sat_solver2_memory_proof( p->pSat );
    double memMap = Vec_VecMemoryInt( (Vec_Vec_t *)p->vId2Lit );
    double memRef = Rnm_ManMemoryUsage( p->pRnm );
    double memHash= sizeof(int) * 6 * p->nTable;
    double memOth = sizeof(Ga2_Man_t);
    memOth += Vec_VecMemoryInt( (Vec_Vec_t *)p->vCnfs );
    memOth += Vec_IntMemory( p->vIds );
    memOth += Vec_IntMemory( p->vProofIds );
    memOth += Vec_IntMemory( p->vAbs );
    memOth += Vec_IntMemory( p->vValues );
    memOth += Vec_IntMemory( p->vLits );
    memOth += Vec_IntMemory( p->vIsopMem );
    memOth += 336450 + (sizeof(char) + sizeof(char*)) * 65536;
    memTot = memAig + memSat + memPro + memMap + memRef + memHash + memOth;
    ABC_PRMP( "Memory: AIG      ", memAig, memTot );
    ABC_PRMP( "Memory: SAT      ", memSat, memTot );
    ABC_PRMP( "Memory: Proof    ", memPro, memTot );
    ABC_PRMP( "Memory: Map      ", memMap, memTot );
    ABC_PRMP( "Memory: Refine   ", memRef, memTot );
    ABC_PRMP( "Memory: Hash     ", memHash,memTot );
    ABC_PRMP( "Memory: Other    ", memOth, memTot );
    ABC_PRMP( "Memory: TOTAL    ", memTot, memTot );
}